

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::SetPropertyDefault(cmTarget *this,string *property,char *default_value)

{
  char *value;
  string var;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"CMAKE_",&local_41);
  std::__cxx11::string::append((string *)&local_40);
  value = cmMakefile::GetDefinition(this->Makefile,&local_40);
  if ((value != (char *)0x0) || (value = default_value, default_value != (char *)0x0)) {
    SetProperty(this,property,value);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmTarget::SetPropertyDefault(const std::string& property,
                                  const char* default_value)
{
  // Compute the name of the variable holding the default value.
  std::string var = "CMAKE_";
  var += property;

  if (const char* value = this->Makefile->GetDefinition(var)) {
    this->SetProperty(property, value);
  } else if (default_value) {
    this->SetProperty(property, default_value);
  }
}